

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O2

void __thiscall tst_qpromise_then::rejectSync(tst_qpromise_then *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar4;
  bool bVar5;
  PromiseData<int> *this_00;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<void> *this_02;
  QPromiseReject<int> *in_R8;
  PromiseResolver<void> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_1a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_1a0;
  PromiseResolver<void> resolver_1;
  QPromiseBase<void> local_180;
  Promise output;
  QPromiseBase<void> local_160;
  _Any_data local_150;
  Data *local_140;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_130;
  QPromiseBase<void> local_128;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_118;
  QPromise<int> input;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  QString error;
  PromiseResolver<int> resolver;
  _Any_data local_98 [2];
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  QPromiseBase<void> local_58;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_48;
  
  local_150._0_4_ = 0x2a;
  QtPromise::QPromise<int>::resolve(&input,(int *)local_150._M_pod_data);
  output.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d6e8;
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012d820;
  output.super_QPromiseBase<int>.m_d.d = this_00;
  local_118.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_118);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_118);
  QVar2 = input.super_QPromiseBase<int>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_150._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    (((QArrayData *)&((Data *)resolver.m_d.d)->super_QSharedData)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((Data *)resolver.m_d.d)->super_QSharedData)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_150._8_8_ = resolver.m_d.d;
  }
  local_180._vptr_QPromiseBase = (_func_int **)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((QArrayData *)&((Data *)resolver.m_d.d)->super_QSharedData)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((Data *)resolver.m_d.d)->super_QSharedData)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_150._8_8_ != (Data *)0x0) {
    LOCK();
    (((QArrayData *)&((Data *)local_150._8_8_)->super_QSharedData)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((Data *)local_150._8_8_)->super_QSharedData)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_150._M_unused._0_8_ = resolver.m_d.d;
  error.d.d = (Data *)local_150._8_8_;
  local_98[0]._0_8_ = resolver.m_d.d;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_150._M_unused._M_object;
  if ((Data *)local_150._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_150._M_unused._0_8_ = *local_150._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_150._8_8_;
  if ((Data *)local_150._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_150._8_8_ = *(int *)local_150._8_8_ + 1;
    UNLOCK();
  }
  pcStack_60 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<int,tst_qpromise_then::rejectSync()::$_0,int>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(tst_qpromise_then::rejectSync()::$_0_const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_150._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QVar2 = input.super_QPromiseBase<int>.m_d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_48,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,local_98,
             (QPromiseResolve<int> *)&error,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&error);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_180);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)local_98)
  ;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  output.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d820;
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(input.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  error.d.size = 0;
  error.d.d = (Data *)0x0;
  error.d.ptr = (char16_t *)0x0;
  local_160._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d688;
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&(this_01->m_lock).field_0x0 = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_01->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_QSharedData).ref = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_01);
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0012d718;
  local_160.m_d.d = (PromiseData<void> *)this_01;
  local_118.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&local_118)
  ;
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_118);
  QVar2 = output.super_QPromiseBase<int>.m_d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_180._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_180._vptr_QPromiseBase = (_func_int **)resolver_1;
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if ((Data *)local_180._vptr_QPromiseBase == (Data *)0x0) {
    local_1a0.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_180._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_1a0.d = (Data *)local_180._vptr_QPromiseBase;
  }
  local_1a8.d = (Data *)0x0;
  if ((Data *)local_180._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((Data *)local_180._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_1a0.d != (Data *)0x0) {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  local_150._M_unused._0_8_ = local_180._vptr_QPromiseBase;
  local_150._8_8_ = local_1a0.d;
  local_140 = (Data *)&error;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x18);
  *(void **)resolver.m_d.d = local_150._M_unused._M_object;
  if ((Data *)local_150._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_150._M_unused._0_8_ = *local_150._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_150._8_8_;
  if ((Data *)local_150._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_150._8_8_ = *(int *)local_150._8_8_ + 1;
    UNLOCK();
  }
  *(Data **)((long)resolver.m_d.d + 0x10) = local_140;
  QtPromisePrivate::PromiseHandler<int,tst_qpromise_then::rejectSync()::$_1,int>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_then::rejectSync()::$_1_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_150._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  QVar2 = output.super_QPromiseBase<int>.m_d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_98,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_180,
             (QPromiseResolve<void> *)&local_1a0,(QPromiseReject<void> *)in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_98);
  std::_Function_base::~_Function_base((_Function_base *)local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_180);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  local_160._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d718;
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(output.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(output.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d688;
  this_02 = (PromiseData<void> *)operator_new(0x58);
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_02->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_02->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_02);
  LOCK();
  pQVar1 = &(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_02 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_02->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_180._vptr_QPromiseBase._0_1_ = 0x18;
  local_180._vptr_QPromiseBase._1_7_ = 0x12d7;
  local_180.m_d.d = this_02;
  local_128.m_d.d = this_02;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_2,(QPromise<void> *)&local_180)
  ;
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_180);
  QVar3.d = local_160.m_d.d;
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_1a0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_1a0 = resolver_2.m_d.d;
  }
  local_1a8.d = (Data *)0x0;
  if (local_1a0.d == (Data *)0x0) {
    local_e0.d = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_e0.d = local_1a0.d;
  }
  local_130.d = (Data *)0x0;
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_()> *)&local_150,(PromiseHandler<void,decltype(nullptr),void> *)0x0,
             &local_1a0,(QPromiseResolve<void> *)&local_e0,(QPromiseReject<void> *)in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_150);
  std::_Function_base::~_Function_base((_Function_base *)&local_150);
  QVar4.d = local_e0.d;
  QVar3.d = local_160.m_d.d;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)local_1a0.d;
  if (local_1a0.d != (Data *)0x0) {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_118.super__Function_base._M_functor._8_8_ = 0;
  local_118.super__Function_base._M_manager = (_Manager_type)0x0;
  local_118._M_invoker = (_Invoker_type)0x0;
  local_118.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  local_118.super__Function_base._M_functor._M_unused._0_8_)->d = (Data *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  ((long)local_118.super__Function_base._M_functor._M_unused._0_8_ + 8))->d = QVar4.d;
  if (QVar4.d != (Data *)0x0) {
    LOCK();
    ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar4.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  ((long)local_118.super__Function_base._M_functor._M_unused._0_8_ + 0x10))->d = (Data *)&error;
  local_118._M_invoker =
       std::
       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
       ::_M_invoke;
  local_118.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
       ::_M_manager;
  QtPromisePrivate::PromiseCatcher<void,tst_qpromise_then::rejectSync()::$_2,QString_const&>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_then::rejectSync()::$_2_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&resolver_1);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<void,_void_()>,&local_118);
  std::_Function_base::~_Function_base(&local_118.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_e0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_130);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_2.m_d);
  local_128._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d718;
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_160.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_160.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  QtPromise::QPromiseBase<void>::wait(&local_58,&local_128);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_58);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_128);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_160);
  QString::QString((QString *)&resolver_1,"foo42");
  bVar5 = QTest::qCompare(&error,(QString *)&resolver_1,"error","QString{\"foo42\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0x83);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver_1);
  if (bVar5) {
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                      (&(input.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    resolver_1.m_d.d._0_1_ = bVar5;
    local_180._vptr_QPromiseBase._0_1_ = 1;
    bVar5 = QTest::qCompare<bool,bool>
                      ((bool *)&resolver_1,(bool *)&local_180,"input.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                       ,0x84);
    if (bVar5) {
      bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isRejected
                        (&(output.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      resolver_1.m_d.d._0_1_ = bVar5;
      local_180._vptr_QPromiseBase._0_1_ = 1;
      QTest::qCompare<bool,bool>
                ((bool *)&resolver_1,(bool *)&local_180,"output.isRejected()","true",
                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                 ,0x85);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&error.d);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&output.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&input.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_qpromise_then::rejectSync()
{
    auto input = QtPromise::QPromise<int>::resolve(42);
    auto output = input.then([](int res) {
        throw QString{"foo%1"}.arg(res);
        return 42;
    });

    QString error;
    output
        .then([&](int res) {
            error += "bar" + QString::number(res);
        })
        .fail([&](const QString& err) {
            error += err;
        })
        .wait();

    QCOMPARE(error, QString{"foo42"});
    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isRejected(), true);
}